

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

void __thiscall
amrex::EB2::Level::fillFaceCent(Level *this,Array<MultiCutFab_*,_3> *a_facecent,Geometry *geom)

{
  int dst_nghost;
  int num_comp;
  MultiCutFab *dstmf;
  FabArray<amrex::FArrayBox> *src;
  int idim;
  long lVar1;
  Periodicity PVar2;
  FabFactory<amrex::FArrayBox> local_1e0;
  MFInfo local_1d8;
  MultiFab tmp;
  
  if (this->m_allregular == true) {
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      MultiCutFab::setVal(a_facecent->_M_elems[lVar1],0.0);
    }
  }
  else {
    src = (FabArray<amrex::FArrayBox> *)&this->m_facecent;
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      dstmf = a_facecent->_M_elems[lVar1];
      local_1d8._1_7_ = 0;
      local_1d8.alloc = true;
      local_1d8.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1d8.arena._0_4_ = 0;
      local_1d8.arena._4_4_ = 0;
      local_1d8.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e0._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
      MultiFab::MultiFab((MultiFab *)&tmp.super_FabArray<amrex::FArrayBox>,
                         &(dstmf->m_data).super_FabArrayBase.boxarray,
                         &(dstmf->m_data).super_FabArrayBase.distributionMap,
                         (dstmf->m_data).super_FabArrayBase.n_comp,
                         (dstmf->m_data).super_FabArrayBase.n_grow.vect[0],&local_1d8,&local_1e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d8.tags.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&tmp.super_FabArray<amrex::FArrayBox>,0.0);
      dst_nghost = (dstmf->m_data).super_FabArrayBase.n_grow.vect[0];
      num_comp = (dstmf->m_data).super_FabArrayBase.n_comp;
      PVar2 = Geometry::periodicity(geom);
      local_1d8.alloc = PVar2.period.vect[0]._0_1_;
      local_1d8._1_7_ = PVar2.period.vect._1_7_;
      local_1d8.arena._0_4_ = PVar2.period.vect[2];
      FabArray<amrex::FArrayBox>::ParallelCopy
                (&tmp.super_FabArray<amrex::FArrayBox>,src,0,0,num_comp,0,dst_nghost,
                 (Periodicity *)&local_1d8,COPY);
      anon_unknown_2::copyMultiFabToMultiCutFab
                (dstmf,(MultiFab *)&tmp.super_FabArray<amrex::FArrayBox>);
      MultiFab::~MultiFab((MultiFab *)&tmp.super_FabArray<amrex::FArrayBox>);
      src = src + 1;
    }
  }
  return;
}

Assistant:

void
Level::fillFaceCent (Array<MultiCutFab*,AMREX_SPACEDIM> const& a_facecent, const Geometry& geom) const
{
    if (isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            a_facecent[idim]->setVal(0.0);
        }
        return;
    }

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        MultiCutFab& facecent = *a_facecent[idim];
        MultiFab tmp(facecent.boxArray(), facecent.DistributionMap(),
                     facecent.nComp(), facecent.nGrow());
        tmp.setVal(0.0);
        tmp.ParallelCopy(m_facecent[idim],0,0,facecent.nComp(),
                         0,facecent.nGrow(),geom.periodicity());
        copyMultiFabToMultiCutFab(facecent,tmp);
    }
}